

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver)

{
  float value;
  double value_00;
  java jVar1;
  string *src;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  Type TVar5;
  Descriptor *descriptor;
  long *plVar6;
  EnumDescriptor *descriptor_00;
  LogMessage *other;
  EnumValueDescriptor *pEVar7;
  undefined8 *puVar8;
  undefined7 in_register_00000009;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  protobuf *ppVar11;
  java *this_00;
  char *pcVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  undefined1 local_258 [56];
  undefined1 local_220 [48];
  string local_1f0;
  string local_1d0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  ppVar11 = (protobuf *)local_258;
  this_00 = this;
  if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
    local_258._0_8_ = FieldDescriptor::TypeOnceInit;
    local_220._0_8_ = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)local_258,
               (FieldDescriptor **)local_220);
    this_00 = (java *)ppVar11;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  case 1:
  case 3:
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10);
    local_258._0_8_ = paVar10;
    local_258._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x40),paVar10->_M_local_buf);
    local_258._8_8_ = local_258._8_8_ + -(long)paVar10;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258._8_8_ + local_258._0_8_);
    pcVar12 = (char *)local_258._0_8_;
    break;
  case 2:
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10);
    local_258._0_8_ = paVar10;
    local_258._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x40),paVar10->_M_local_buf);
    local_258._8_8_ = local_258._8_8_ + -(long)paVar10;
    local_220._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_220 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,local_258._0_8_,(char *)(local_258._8_8_ + local_258._0_8_));
    plVar6 = (long *)std::__cxx11::string::append((char *)local_220);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    _Var14._M_p = (pointer)local_220._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_220 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_0024b40d;
  case 4:
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10);
    local_258._0_8_ = paVar10;
    local_258._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x40),paVar10->_M_local_buf);
    local_258._8_8_ = local_258._8_8_ + -(long)paVar10;
    local_220._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_220 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,local_258._0_8_,(char *)(local_258._8_8_ + local_258._0_8_));
    plVar6 = (long *)std::__cxx11::string::append((char *)local_220);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    _Var14._M_p = (pointer)local_220._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_220 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_0024b40d;
  case 5:
    value_00 = *(double *)(this + 0x40);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_((string *)local_258,(protobuf *)this_00,value_00);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258,"D");
          _Var14._M_p = (pointer)local_258._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10)) {
            return __return_storage_ptr__;
          }
          goto LAB_0024b40d;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar12 = "Double.NaN";
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x3dee6a;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar12 = "Double.NEGATIVE_INFINITY";
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x3dee5f;
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = "Double.POSITIVE_INFINITY";
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x3dee46;
    }
    break;
  case 6:
    value = *(float *)(this + 0x40);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_((string *)local_258,(protobuf *)this_00,value);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258,"F");
          _Var14._M_p = (pointer)local_258._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_258 + 0x10)) {
            return __return_storage_ptr__;
          }
          goto LAB_0024b40d;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar12 = "Float.NaN";
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x3deea4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar12 = "Float.NEGATIVE_INFINITY";
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x3dee9a;
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = "Float.POSITIVE_INFINITY";
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x3dee82;
    }
    break;
  case 7:
    jVar1 = this[0x40];
    pcVar12 = "false";
    if ((ulong)(byte)jVar1 != 0) {
      pcVar12 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pcVar12 + ((ulong)(byte)jVar1 ^ 5));
    break;
  case 8:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_220,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor_00,SUB81(field,0));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar10) {
      local_258._16_8_ = paVar10->_M_allocated_capacity;
      local_258._24_8_ = puVar8[3];
      local_258._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_258 + 0x10);
    }
    else {
      local_258._16_8_ = paVar10->_M_allocated_capacity;
      local_258._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_258._8_8_ = puVar8[1];
    *puVar8 = paVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    pEVar7 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    plVar6 = (long *)std::__cxx11::string::_M_append(local_258,**(ulong **)(pEVar7 + 8));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_);
    }
    _Var14._M_p = (pointer)local_220._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_220 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_0024b40d;
  case 9:
    TVar5 = GetType((FieldDescriptor *)this);
    if (TVar5 == TYPE_BYTES) {
      if (((byte)this[1] & 1) != 0) {
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")","")
        ;
        CEscape(&local_1f0,*(string **)(this + 0x40));
        local_258._0_8_ = local_1f0._M_dataplus._M_p;
        local_258._8_4_ = (undefined4)local_1f0._M_string_length;
        local_220._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_220._8_4_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        strings::Substitute(__return_storage_ptr__,&local_1d0,(SubstituteArg *)local_258,
                            (SubstituteArg *)local_220,&local_60,&local_90,&local_c0,&local_f0,
                            &local_120,&local_150,&local_180,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        _Var14._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0024b40d;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = "com.google.protobuf.ByteString.EMPTY";
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x3deefe;
      break;
    }
    src = *(string **)(this + 0x40);
    uVar2 = src->_M_string_length;
    if (uVar2 == 0) {
LAB_0024b29d:
      CEscape((string *)local_220,src);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_220,0,(char *)0x0,0x3dd42c);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar10) {
        local_258._16_8_ = paVar10->_M_allocated_capacity;
        local_258._24_8_ = puVar8[3];
        local_258._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_258 + 0x10);
      }
      else {
        local_258._16_8_ = paVar10->_M_allocated_capacity;
        local_258._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
      }
      local_258._8_8_ = puVar8[1];
      *puVar8 = paVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_258);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar9) {
        lVar3 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_);
      }
      _Var14._M_p = (pointer)local_220._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_220 + 0x10)) {
        return __return_storage_ptr__;
      }
    }
    else {
      pcVar12 = (src->_M_dataplus)._M_p;
      if (-1 < *pcVar12) {
        uVar4 = 1;
        do {
          uVar13 = uVar4;
          if (uVar2 == uVar13) break;
          uVar4 = uVar13 + 1;
        } while (-1 < pcVar12[uVar13]);
        if (uVar2 <= uVar13) goto LAB_0024b29d;
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,"com.google.protobuf.Internal.stringDefaultValue(\"$0\")","");
      CEscape(&local_1f0,*(string **)(this + 0x40));
      local_258._0_8_ = local_1f0._M_dataplus._M_p;
      local_258._8_4_ = (undefined4)local_1f0._M_string_length;
      local_220._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_220._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::Substitute(__return_storage_ptr__,&local_1d0,(SubstituteArg *)local_258,
                          (SubstituteArg *)local_220,&local_60,&local_90,&local_c0,&local_f0,
                          &local_120,&local_150,&local_180,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      _Var14._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
        return __return_storage_ptr__;
      }
    }
    goto LAB_0024b40d;
  case 10:
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_258,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor,SUB81(field,0));
    plVar6 = (long *)std::__cxx11::string::append(local_258);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    _Var14._M_p = (pointer)local_258._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_258 + 0x10)) {
      return __return_storage_ptr__;
    }
LAB_0024b40d:
    operator_delete(_Var14._M_p);
    return __return_storage_ptr__;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_258,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x285);
    other = internal::LogMessage::operator<<((LogMessage *)local_258,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_220,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_258);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x3d75d9;
    pcVar12 = (char *)paVar10;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar12,paVar10);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return StrCat(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return name_resolver->GetClassName(field->enum_type(), immutable) + "." +
             field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return name_resolver->GetClassName(field->message_type(), immutable) +
             ".getDefaultInstance()";

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}